

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

void __thiscall
t_java_generator::generate_deserialize_container
          (t_java_generator *this,ostream *out,t_type *ttype,string *prefix,bool has_metadata)

{
  bool bVar1;
  uint uVar2;
  t_type *ptVar3;
  ostream *poVar4;
  char *pcVar5;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  allocator local_131;
  string local_130;
  string local_110;
  allocator local_e9;
  string local_e8;
  string local_c8;
  allocator local_a1;
  string local_a0;
  string local_80;
  string local_50 [8];
  string obj;
  bool has_metadata_local;
  string *prefix_local;
  t_type *ttype_local;
  ostream *out_local;
  t_java_generator *this_local;
  
  obj.field_2._M_local_buf[0xf] = has_metadata;
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  std::__cxx11::string::string(local_50);
  uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
  if ((uVar2 & 1) == 0) {
    uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
    if ((uVar2 & 1) == 0) {
      uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
      if ((uVar2 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_130,"_list",&local_131);
        t_generator::tmp(&local_110,(t_generator *)this,&local_130);
        std::__cxx11::string::operator=(local_50,(string *)&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_130);
        std::allocator<char>::~allocator((allocator<char> *)&local_131);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e8,"_set",&local_e9);
      t_generator::tmp(&local_c8,(t_generator *)this,&local_e8);
      std::__cxx11::string::operator=(local_50,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a0,"_map",&local_a1);
    t_generator::tmp(&local_80,(t_generator *)this,&local_a0);
    std::__cxx11::string::operator=(local_50,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  if ((obj.field_2._M_local_buf[0xf] & 1U) == 0) {
    uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
    if ((uVar2 & 1) == 0) {
      uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
      if ((uVar2 & 1) == 0) {
        uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
        if ((uVar2 & 1) != 0) {
          poVar4 = t_generator::indent((t_generator *)this,out);
          poVar4 = std::operator<<(poVar4,"org.apache.thrift.protocol.TList ");
          poVar4 = std::operator<<(poVar4,local_50);
          poVar4 = std::operator<<(poVar4," = iprot.readListBegin(");
          ptVar3 = t_list::get_elem_type((t_list *)ttype);
          type_to_enum_abi_cxx11_(&local_1b8,this,ptVar3);
          poVar4 = std::operator<<(poVar4,(string *)&local_1b8);
          poVar4 = std::operator<<(poVar4,");");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_1b8);
        }
      }
      else {
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"org.apache.thrift.protocol.TSet ");
        poVar4 = std::operator<<(poVar4,local_50);
        poVar4 = std::operator<<(poVar4," = iprot.readSetBegin(");
        ptVar3 = t_set::get_elem_type((t_set *)ttype);
        type_to_enum_abi_cxx11_(&local_198,this,ptVar3);
        poVar4 = std::operator<<(poVar4,(string *)&local_198);
        poVar4 = std::operator<<(poVar4,");");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_198);
      }
    }
    else {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"org.apache.thrift.protocol.TMap ");
      poVar4 = std::operator<<(poVar4,local_50);
      poVar4 = std::operator<<(poVar4," = iprot.readMapBegin(");
      ptVar3 = t_map::get_key_type((t_map *)ttype);
      type_to_enum_abi_cxx11_(&local_158,this,ptVar3);
      poVar4 = std::operator<<(poVar4,(string *)&local_158);
      poVar4 = std::operator<<(poVar4,", ");
      ptVar3 = t_map::get_val_type((t_map *)ttype);
      type_to_enum_abi_cxx11_(&local_178,this,ptVar3);
      poVar4 = std::operator<<(poVar4,(string *)&local_178);
      poVar4 = std::operator<<(poVar4,"); ");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_158);
    }
  }
  else {
    uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
    if ((uVar2 & 1) == 0) {
      uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
      if ((uVar2 & 1) == 0) {
        uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
        if ((uVar2 & 1) != 0) {
          poVar4 = t_generator::indent((t_generator *)this,out);
          poVar4 = std::operator<<(poVar4,"org.apache.thrift.protocol.TList ");
          poVar4 = std::operator<<(poVar4,local_50);
          poVar4 = std::operator<<(poVar4," = iprot.readListBegin();");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        }
      }
      else {
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"org.apache.thrift.protocol.TSet ");
        poVar4 = std::operator<<(poVar4,local_50);
        poVar4 = std::operator<<(poVar4," = iprot.readSetBegin();");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      }
    }
    else {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"org.apache.thrift.protocol.TMap ");
      poVar4 = std::operator<<(poVar4,local_50);
      poVar4 = std::operator<<(poVar4," = iprot.readMapBegin();");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
  }
  if ((this->reuse_objects_ & 1U) != 0) {
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"if (");
    poVar4 = std::operator<<(poVar4,(string *)prefix);
    poVar4 = std::operator<<(poVar4," == null) {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
  }
  bVar1 = is_enum_set(this,ttype);
  if (bVar1) {
    t_generator::indent_abi_cxx11_(&local_1d8,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_1d8);
    poVar4 = std::operator<<(poVar4,(string *)prefix);
    poVar4 = std::operator<<(poVar4," = ");
    type_name_abi_cxx11_(&local_1f8,this,ttype,false,true,true,false);
    poVar4 = std::operator<<(poVar4,(string *)&local_1f8);
    std::operator<<(poVar4,".noneOf");
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_218,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_218);
    poVar4 = std::operator<<(poVar4,(string *)prefix);
    poVar4 = std::operator<<(poVar4," = new ");
    type_name_abi_cxx11_(&local_238,this,ttype,false,true,false,false);
    std::operator<<(poVar4,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_218);
  }
  bVar1 = is_enum_set(this,ttype);
  if ((bVar1) || (bVar1 = is_enum_map(this,ttype), bVar1)) {
    poVar4 = std::operator<<(out,"(");
    inner_enum_type_name_abi_cxx11_(&local_258,this,ttype);
    poVar4 = std::operator<<(poVar4,(string *)&local_258);
    poVar4 = std::operator<<(poVar4,");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_258);
  }
  else if (((this->sorted_containers_ & 1U) == 0) ||
          ((uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(), (uVar2 & 1) == 0 &&
           (uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(), (uVar2 & 1) == 0)))) {
    poVar4 = std::operator<<(out,"(");
    uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
    pcVar5 = "2*";
    if ((uVar2 & 1) != 0) {
      pcVar5 = "";
    }
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,local_50);
    poVar4 = std::operator<<(poVar4,".size");
    poVar4 = std::operator<<(poVar4,");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  else {
    poVar4 = std::operator<<(out,"();");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  if ((this->reuse_objects_ & 1U) != 0) {
    t_generator::indent_down((t_generator *)this);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"}");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
  if ((uVar2 & 1) == 0) {
    uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
    if ((uVar2 & 1) == 0) {
      uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
      if ((uVar2 & 1) != 0) {
        std::__cxx11::string::string((string *)&local_2f8,(string *)prefix);
        std::__cxx11::string::string((string *)&local_318,local_50);
        generate_deserialize_list_element
                  (this,out,(t_list *)ttype,&local_2f8,&local_318,
                   (bool)(obj.field_2._M_local_buf[0xf] & 1));
        std::__cxx11::string::~string((string *)&local_318);
        std::__cxx11::string::~string((string *)&local_2f8);
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_2b8,(string *)prefix);
      std::__cxx11::string::string((string *)&local_2d8,local_50);
      generate_deserialize_set_element
                (this,out,(t_set *)ttype,&local_2b8,&local_2d8,
                 (bool)(obj.field_2._M_local_buf[0xf] & 1));
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2b8);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_278,(string *)prefix);
    std::__cxx11::string::string((string *)&local_298,local_50);
    generate_deserialize_map_element
              (this,out,(t_map *)ttype,&local_278,&local_298,
               (bool)(obj.field_2._M_local_buf[0xf] & 1));
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_278);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  if ((obj.field_2._M_local_buf[0xf] & 1U) != 0) {
    uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
    if ((uVar2 & 1) == 0) {
      uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
      if ((uVar2 & 1) == 0) {
        uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
        if ((uVar2 & 1) != 0) {
          poVar4 = t_generator::indent((t_generator *)this,out);
          poVar4 = std::operator<<(poVar4,"iprot.readListEnd();");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        }
      }
      else {
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"iprot.readSetEnd();");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      }
    }
    else {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"iprot.readMapEnd();");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void t_java_generator::generate_deserialize_container(ostream& out,
                                                      t_type* ttype,
                                                      string prefix,
                                                      bool has_metadata) {

  scope_up(out);

  string obj;

  if (ttype->is_map()) {
    obj = tmp("_map");
  } else if (ttype->is_set()) {
    obj = tmp("_set");
  } else if (ttype->is_list()) {
    obj = tmp("_list");
  }

  if (has_metadata) {
    // Declare variables, read header
    if (ttype->is_map()) {
      indent(out) << "org.apache.thrift.protocol.TMap " << obj << " = iprot.readMapBegin();"
                  << endl;
    } else if (ttype->is_set()) {
      indent(out) << "org.apache.thrift.protocol.TSet " << obj << " = iprot.readSetBegin();"
                  << endl;
    } else if (ttype->is_list()) {
      indent(out) << "org.apache.thrift.protocol.TList " << obj << " = iprot.readListBegin();"
                  << endl;
    }
  } else {
    // Declare variables, read header
    if (ttype->is_map()) {
      indent(out) << "org.apache.thrift.protocol.TMap " << obj
                  << " = iprot.readMapBegin("
                  << type_to_enum(((t_map*)ttype)->get_key_type()) << ", "
                  << type_to_enum(((t_map*)ttype)->get_val_type()) << "); "<< endl;
    } else if (ttype->is_set()) {
      indent(out) << "org.apache.thrift.protocol.TSet " << obj
                  << " = iprot.readSetBegin("
                  << type_to_enum(((t_set*)ttype)->get_elem_type()) << ");"
                  << endl;
    } else if (ttype->is_list()) {
      indent(out) << "org.apache.thrift.protocol.TList " << obj
                  << " = iprot.readListBegin("
                  << type_to_enum(((t_list*)ttype)->get_elem_type()) << ");"
                  << endl;
    }
  }

  if (reuse_objects_) {
    indent(out) << "if (" << prefix << " == null) {" << endl;
    indent_up();
  }

  if (is_enum_set(ttype)) {
    out << indent() << prefix << " = " << type_name(ttype, false, true, true) << ".noneOf";
  } else {
    out << indent() << prefix << " = new " << type_name(ttype, false, true);
  }

  // construct the collection correctly i.e. with appropriate size/type
  if (is_enum_set(ttype) || is_enum_map(ttype)) {
    out << "(" << inner_enum_type_name(ttype) << ");" << endl;
  } else if (sorted_containers_ && (ttype->is_map() || ttype->is_set())) {
    // TreeSet and TreeMap don't have any constructor which takes a capacity as an argument
    out << "();" << endl;
  } else {
    out << "(" << (ttype->is_list() ? "" : "2*") << obj << ".size"
        << ");" << endl;
  }

  if (reuse_objects_) {
    indent_down();
    indent(out) << "}" << endl;
  }

  if (ttype->is_map()) {
    generate_deserialize_map_element(out, (t_map*)ttype, prefix, obj, has_metadata);
  } else if (ttype->is_set()) {
    generate_deserialize_set_element(out, (t_set*)ttype, prefix, obj, has_metadata);
  } else if (ttype->is_list()) {
    generate_deserialize_list_element(out, (t_list*)ttype, prefix, obj, has_metadata);
  }

  scope_down(out);

  if (has_metadata) {
    // Read container end
    if (ttype->is_map()) {
      indent(out) << "iprot.readMapEnd();" << endl;
    } else if (ttype->is_set()) {
      indent(out) << "iprot.readSetEnd();" << endl;
    } else if (ttype->is_list()) {
      indent(out) << "iprot.readListEnd();" << endl;
    }
  }
  scope_down(out);
}